

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

AssertionResult
testing::internal::HasOneFailure
          (char *param_1,char *param_2,char *param_3,TestPartResultArray *results,Type type,
          string *substr)

{
  int iVar1;
  Type TVar2;
  TestPartResult *pTVar3;
  AssertionResult *pAVar4;
  char *pcVar5;
  AssertionResult *this;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  undefined8 in_RDI;
  Type in_R9D;
  AssertionResult AVar6;
  TestPartResult *r;
  int i;
  Message msg;
  String expected;
  String *in_stack_fffffffffffffe80;
  TestPartResult *in_stack_fffffffffffffe88;
  String *in_stack_fffffffffffffe90;
  TestPartResult *in_stack_fffffffffffffea8;
  AssertionResult *in_stack_fffffffffffffeb0;
  AssertionResult *in_stack_fffffffffffffeb8;
  AssertionResult *in_stack_fffffffffffffec0;
  int local_5c;
  
  String::String(in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88);
  Message::Message((Message *)in_stack_fffffffffffffeb0);
  iVar1 = TestPartResultArray::size((TestPartResultArray *)0x1e8c97);
  if (iVar1 == 1) {
    pTVar3 = TestPartResultArray::GetTestPartResult
                       ((TestPartResultArray *)in_stack_fffffffffffffe90,
                        (int)((ulong)in_stack_fffffffffffffe88 >> 0x20));
    TVar2 = TestPartResult::type(pTVar3);
    if (TVar2 == in_R9D) {
      pAVar4 = (AssertionResult *)TestPartResult::message((TestPartResult *)0x1e9023);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      pcVar5 = strstr(&pAVar4->success_,pcVar5);
      if (pcVar5 == (char *)0x0) {
        AssertionFailure();
        this = AssertionResult::operator<<
                         (in_stack_fffffffffffffeb0,(char (*) [11])in_stack_fffffffffffffea8);
        pTVar3 = (TestPartResult *)
                 AssertionResult::operator<<(this,(String *)in_stack_fffffffffffffea8);
        AssertionResult::operator<<(this,(char (*) [14])pTVar3);
        AssertionResult::operator<<
                  (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pTVar3)
        ;
        AssertionResult::operator<<(this,(char (*) [3])pTVar3);
        AssertionResult::operator<<(this,(char (*) [11])pTVar3);
        in_stack_fffffffffffffe80 = (String *)AssertionResult::operator<<(this,pTVar3);
        AssertionResult::AssertionResult(in_stack_fffffffffffffec0,pAVar4);
        AssertionResult::~AssertionResult((AssertionResult *)0x1e912c);
      }
      else {
        AssertionSuccess();
      }
    }
    else {
      AssertionFailure();
      AssertionResult::operator<<
                (in_stack_fffffffffffffeb0,(char (*) [11])in_stack_fffffffffffffea8);
      AssertionResult::operator<<(in_stack_fffffffffffffeb0,(String *)in_stack_fffffffffffffea8);
      AssertionResult::operator<<(in_stack_fffffffffffffeb0,(char (*) [2])in_stack_fffffffffffffea8)
      ;
      AssertionResult::operator<<
                (in_stack_fffffffffffffeb0,(char (*) [11])in_stack_fffffffffffffea8);
      pAVar4 = AssertionResult::operator<<(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      AssertionResult::AssertionResult(pAVar4,in_stack_fffffffffffffeb8);
      AssertionResult::~AssertionResult((AssertionResult *)0x1e8fe0);
    }
  }
  else {
    Message::operator<<((Message *)in_stack_fffffffffffffe90,
                        (char (*) [11])in_stack_fffffffffffffe88);
    Message::operator<<((Message *)in_stack_fffffffffffffe90,(String *)in_stack_fffffffffffffe88);
    Message::operator<<((Message *)in_stack_fffffffffffffe90,(char (*) [2])in_stack_fffffffffffffe88
                       );
    Message::operator<<((Message *)in_stack_fffffffffffffe90,
                        (char (*) [11])in_stack_fffffffffffffe88);
    TestPartResultArray::size((TestPartResultArray *)0x1e8d36);
    Message::operator<<((Message *)in_stack_fffffffffffffe90,(int *)in_stack_fffffffffffffe88);
    Message::operator<<((Message *)in_stack_fffffffffffffe90,
                        (char (*) [10])in_stack_fffffffffffffe88);
    for (local_5c = 0; iVar1 = TestPartResultArray::size((TestPartResultArray *)0x1e8da8),
        local_5c < iVar1; local_5c = local_5c + 1) {
      Message::operator<<((Message *)in_stack_fffffffffffffe90,
                          (char (*) [2])in_stack_fffffffffffffe88);
      TestPartResultArray::GetTestPartResult
                ((TestPartResultArray *)in_stack_fffffffffffffe90,
                 (int)((ulong)in_stack_fffffffffffffe88 >> 0x20));
      Message::operator<<((Message *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    }
    AssertionFailure();
    AssertionResult::operator<<(in_stack_fffffffffffffeb0,(Message *)in_stack_fffffffffffffea8);
    AssertionResult::AssertionResult(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    AssertionResult::~AssertionResult((AssertionResult *)0x1e8eb6);
  }
  Message::~Message((Message *)0x1e9183);
  String::~String(in_stack_fffffffffffffe80);
  AVar6.message_.ptr_ = extraout_RDX.ptr_;
  AVar6._0_8_ = in_RDI;
  return AVar6;
}

Assistant:

AssertionResult HasOneFailure(const char* /* results_expr */,
                              const char* /* type_expr */,
                              const char* /* substr_expr */,
                              const TestPartResultArray& results,
                              TestPartResult::Type type,
                              const string& substr) {
  const String expected(type == TestPartResult::kFatalFailure ?
                        "1 fatal failure" :
                        "1 non-fatal failure");
  Message msg;
  if (results.size() != 1) {
    msg << "Expected: " << expected << "\n"
        << "  Actual: " << results.size() << " failures";
    for (int i = 0; i < results.size(); i++) {
      msg << "\n" << results.GetTestPartResult(i);
    }
    return AssertionFailure() << msg;
  }

  const TestPartResult& r = results.GetTestPartResult(0);
  if (r.type() != type) {
    return AssertionFailure() << "Expected: " << expected << "\n"
                              << "  Actual:\n"
                              << r;
  }

  if (strstr(r.message(), substr.c_str()) == NULL) {
    return AssertionFailure() << "Expected: " << expected << " containing \""
                              << substr << "\"\n"
                              << "  Actual:\n"
                              << r;
  }

  return AssertionSuccess();
}